

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

SRCINFO * __thiscall Js::ScriptContext::GetModuleSrcInfo(ScriptContext *this,ModuleID moduleID)

{
  JavascriptLibrary *pJVar1;
  Recycler *pRVar2;
  WriteBarrierPtr<const_SRCINFO> *dst;
  SRCINFO *ptr;
  ulong count;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (this->moduleSrcInfoCount <= moduleID) {
    count = (ulong)(moduleID + 4);
    local_58 = (undefined1  [8])&Memory::WriteBarrierPtr<SRCINFO_const>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_2cb70d5;
    data.filename._0_4_ = 0xc32;
    data.plusSize = count;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    dst = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<SRCINFO_const>,false>
                    ((Memory *)pRVar2,(Recycler *)Memory::Recycler::AllocZero,0,count);
    Memory::
    CopyArray<Memory::WriteBarrierPtr<SRCINFO_const>,Memory::WriteBarrierPtr<SRCINFO_const>,Memory::Recycler>
              (dst,count,&(((this->super_ScriptContextBase).javascriptLibrary)->cache).moduleSrcInfo
               ,(ulong)this->moduleSrcInfoCount);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<const_SRCINFO>_>::WriteBarrierSet
              (&(((this->super_ScriptContextBase).javascriptLibrary)->cache).moduleSrcInfo,dst);
    this->moduleSrcInfoCount = moduleID + 4;
    pJVar1 = (this->super_ScriptContextBase).javascriptLibrary;
    Memory::WriteBarrierPtr<const_SRCINFO>::WriteBarrierSet
              ((pJVar1->cache).moduleSrcInfo.ptr,(pJVar1->cache).noContextGlobalSourceInfo.ptr);
  }
  ptr = (((this->super_ScriptContextBase).javascriptLibrary)->cache).moduleSrcInfo.ptr[moduleID].ptr
  ;
  if (ptr == (SRCINFO *)0x0) {
    local_58 = (undefined1  [8])&SRCINFO::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2cb70d5;
    data.filename._0_4_ = 0xc3c;
    pRVar2 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_58);
    ptr = (SRCINFO *)new<Memory::Recycler>(0x28,pRVar2,0x51e21e);
    (ptr->sourceContextInfo).ptr = (SourceContextInfo *)0x0;
    Memory::WriteBarrierPtr<SourceContextInfo>::operator=
              ((WriteBarrierPtr<SourceContextInfo> *)ptr,
               &(((this->super_ScriptContextBase).javascriptLibrary)->cache).
                noContextSourceContextInfo);
    ptr->moduleID = moduleID;
    Memory::WriteBarrierPtr<const_SRCINFO>::WriteBarrierSet
              ((((this->super_ScriptContextBase).javascriptLibrary)->cache).moduleSrcInfo.ptr +
               moduleID,ptr);
  }
  return ptr;
}

Assistant:

SRCINFO const *
        ScriptContext::GetModuleSrcInfo(Js::ModuleID moduleID)
    {
            if (moduleSrcInfoCount <= moduleID)
            {
                uint newCount = moduleID + 4;  // Preallocate 4 more slots, moduleID don't usually grow much

                Field(SRCINFO const *)* newModuleSrcInfo = RecyclerNewArrayZ(this->GetRecycler(), Field(SRCINFO const*), newCount);
                CopyArray(newModuleSrcInfo, newCount, Cache()->moduleSrcInfo, moduleSrcInfoCount);
                Cache()->moduleSrcInfo = newModuleSrcInfo;
                moduleSrcInfoCount = newCount;
                Cache()->moduleSrcInfo[0] = this->Cache()->noContextGlobalSourceInfo;
            }

            SRCINFO const * si = Cache()->moduleSrcInfo[moduleID];
            if (si == nullptr)
            {
                SRCINFO * newSrcInfo = RecyclerNewStructZ(this->GetRecycler(), SRCINFO);
                newSrcInfo->sourceContextInfo = this->Cache()->noContextSourceContextInfo;
                newSrcInfo->moduleID = moduleID;
                Cache()->moduleSrcInfo[moduleID] = newSrcInfo;
                si = newSrcInfo;
            }
            return si;
    }